

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O0

int jas_image_ishomosamp(jas_image_t *image)

{
  uint local_28;
  uint i;
  int result;
  jas_image_coord_t vstep;
  jas_image_coord_t hstep;
  jas_image_t *image_local;
  
  local_28 = 0;
  while( true ) {
    if (image->numcmpts_ <= local_28) {
      return 1;
    }
    if ((image->cmpts_[local_28]->hstep_ != (*image->cmpts_)->hstep_) ||
       (image->cmpts_[local_28]->vstep_ != (*image->cmpts_)->vstep_)) break;
    local_28 = local_28 + 1;
  }
  return 0;
}

Assistant:

int jas_image_ishomosamp(const jas_image_t *image)
{
	jas_image_coord_t hstep;
	jas_image_coord_t vstep;
	int result;
	hstep = jas_image_cmpthstep(image, 0);
	vstep = jas_image_cmptvstep(image, 0);
	result = 1;
	for (unsigned i = 0; i < image->numcmpts_; ++i) {
		if (jas_image_cmpthstep(image, i) != hstep ||
		  jas_image_cmptvstep(image, i) != vstep) {
			result = 0;
			break;
		}
	}
	return result;
}